

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadstorage.cpp
# Opt level: O2

void QThreadStoragePrivate::finish(QList<void_*> *tls)

{
  void *pvVar1;
  bool bVar2;
  Type *pTVar3;
  iterator iVar4;
  pointer ppvVar5;
  QThread *pQVar6;
  uint uVar7;
  QBasicMutex *this;
  _func_void_void_ptr *p_Var8;
  ulong size;
  long in_FS_OFFSET;
  QMessageLogger local_68;
  QMutexLocker<QBasicMutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((tls->d).size != 0) &&
     (pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
               operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                           *)tls), pTVar3 != (Type *)0x0)) {
    while ((tls->d).size != 0) {
      iVar4 = QList<void_*>::end(tls);
      pvVar1 = iVar4.i[-1];
      iVar4.i[-1] = (void *)0x0;
      uVar7 = (int)(tls->d).size - 1;
      size = (ulong)(int)uVar7;
      QList<void_*>::resize(tls,size);
      if (pvVar1 != (void *)0x0) {
        local_48.m_isLocked = false;
        local_48._9_7_ = 0xaaaaaaaaaaaaaa;
        local_48.m_mutex = &destructorsMutex;
        this = &destructorsMutex;
        QBasicMutex::lock(&destructorsMutex);
        local_48.m_isLocked = true;
        pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>::
                 operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_destructors>_>
                             *)this);
        if (size < (ulong)(pTVar3->d).size) {
          p_Var8 = (pTVar3->d).ptr[size];
        }
        else {
          p_Var8 = (_func_void_void_ptr *)0x0;
        }
        QBasicMutex::unlock(local_48.m_mutex);
        local_48._8_8_ = (ulong)(uint7)local_48._9_7_ << 8;
        if (p_Var8 == (_func_void_void_ptr *)0x0) {
          bVar2 = QCoreApplication::instanceExists();
          if (bVar2) {
            local_68.context.version = 2;
            local_68.context._4_8_ = 0;
            local_68.context._12_8_ = 0;
            local_68.context.function._4_4_ = 0;
            local_68.context.category = "default";
            pQVar6 = QThread::currentThread();
            QMessageLogger::warning
                      (&local_68,"QThreadStorage: entry %d destroyed before end of thread %p",
                       (ulong)uVar7,pQVar6);
          }
        }
        else {
          (*p_Var8)(pvVar1);
          if ((long)size < (tls->d).size) {
            ppvVar5 = QList<void_*>::data(tls);
            ppvVar5[size] = (void *)0x0;
          }
        }
        QMutexLocker<QBasicMutex>::~QMutexLocker(&local_48);
      }
    }
    QList<void_*>::clear(tls);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThreadStoragePrivate::finish(QList<void *> *tls)
{
    if (tls->isEmpty() || !destructors())
        return; // nothing to do

    DEBUG_MSG("QThreadStorageData: Destroying storage for thread %p", QThread::currentThread());
    while (!tls->isEmpty()) {
        void *&value = tls->last();
        void *q = value;
        value = nullptr;
        int i = tls->size() - 1;
        tls->resize(i);

        if (!q) {
            // data already deleted
            continue;
        }

        QMutexLocker locker(&destructorsMutex);
        void (*destructor)(void *) = destructors()->value(i);
        locker.unlock();

        if (!destructor) {
            if (QCoreApplication::instanceExists())
                qWarning("QThreadStorage: entry %d destroyed before end of thread %p",
                         i, QThread::currentThread());
            continue;
        }
        destructor(q); //crash here might mean the thread exited after qthreadstorage was destroyed

        if (tls->size() > i) {
            //re reset the tls in case it has been recreated by its own destructor.
            (*tls)[i] = nullptr;
        }
    }
    tls->clear();
}